

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty(IfcComplexProperty *this)

{
  ~IfcComplexProperty((IfcComplexProperty *)&this[-1].super_IfcProperty.field_0x60);
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}